

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

type * __thiscall
fmt::v5::sprintf<fmt::v5::basic_string_view<char>,long_double>
          (type *__return_storage_ptr__,v5 *this,basic_string_view<char> *format,longdouble *args)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
  in_R8;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_00;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_long_double>
  as;
  char *local_28;
  undefined2 local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_28 = format->data_;
  local_20 = (undefined2)(int)format->size_;
  local_18 = *(undefined8 *)this;
  uStack_10 = *(undefined8 *)(this + 8);
  args_00.field_1.values_ = in_R8.values_;
  args_00.types_ = (unsigned_long_long)&local_28;
  vsprintf<fmt::v5::basic_string_view<char>,char>
            (__return_storage_ptr__,(v5 *)&local_18,
             format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,long_double>
             ::TYPES,args_00);
  return __return_storage_ptr__;
}

Assistant:

sprintf(const S &format, const Args & ... args) {
  internal::check_format_string<Args...>(format);
  typedef internal::basic_buffer<FMT_CHAR(S)> buffer;
  typedef typename basic_printf_context_t<buffer>::type context;
  format_arg_store<context, Args...> as{ args... };
  return vsprintf(to_string_view(format),
                  basic_format_args<context>(as));
}